

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::Boxed_Number::go<unsigned_char,float>
          (Boxed_Number *this,Opers t_oper,Boxed_Value *t_bv,uchar *t_lhs,uchar *c_lhs,float *c_rhs)

{
  uchar uVar1;
  undefined8 *puVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  bool bVar4;
  bool bVar5;
  float fVar6;
  Boxed_Value BVar7;
  
  switch(t_oper) {
  case equals:
    bVar4 = (float)*c_lhs == *c_rhs;
    break;
  case less_than:
    bVar4 = *c_rhs == (float)*c_lhs;
    bVar5 = *c_rhs < (float)*c_lhs;
    goto LAB_0020d501;
  case greater_than:
    bVar4 = (float)*c_lhs == *c_rhs;
    bVar5 = (float)*c_lhs < *c_rhs;
LAB_0020d501:
    bVar4 = !bVar5 && !bVar4;
    goto LAB_0020d53c;
  case less_than_equal:
    bVar4 = *c_rhs < (float)*c_lhs;
    goto LAB_0020d4da;
  case greater_than_equal:
    bVar4 = (float)*c_lhs < *c_rhs;
LAB_0020d4da:
    bVar4 = !bVar4;
    goto LAB_0020d53c;
  case not_equal:
    bVar4 = (float)*c_lhs != *c_rhs;
    break;
  default:
    switch(t_oper) {
    case sum:
      break;
    case quotient:
      break;
    case product:
      break;
    case difference:
      break;
    default:
      if (t_lhs == (uchar *)0x0) {
switchD_0020d49d_caseD_7:
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = &PTR__bad_cast_00284a30;
        __cxa_throw(puVar2,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      switch(t_oper) {
      case assign:
        uVar1 = (uchar)(int)*c_rhs;
        goto LAB_0020d587;
      default:
        goto switchD_0020d49d_caseD_7;
      case assign_product:
        fVar6 = (float)*t_lhs * *c_rhs;
        break;
      case assign_sum:
        fVar6 = (float)*t_lhs + *c_rhs;
        break;
      case assign_quotient:
        fVar6 = (float)*t_lhs / *c_rhs;
        break;
      case assign_difference:
        fVar6 = (float)*t_lhs - *c_rhs;
      }
      uVar1 = (uchar)(int)fVar6;
LAB_0020d587:
      *t_lhs = uVar1;
      std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)t_bv);
      _Var3._M_pi = extraout_RDX;
      goto LAB_0020d544;
    }
    BVar7 = detail::const_var_impl<float>((float *)this);
    _Var3._M_pi = BVar7.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    goto LAB_0020d544;
  }
  bVar4 = (bool)(-bVar4 & 1);
LAB_0020d53c:
  BVar7 = const_var((chaiscript *)this,bVar4);
  _Var3._M_pi = BVar7.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
LAB_0020d544:
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_bv, LHS *t_lhs, const LHS &c_lhs, const RHS &c_rhs) {
      switch (t_oper) {
        case Operators::Opers::equals:
          return const_var(c_lhs == c_rhs);
        case Operators::Opers::less_than:
          return const_var(c_lhs < c_rhs);
        case Operators::Opers::greater_than:
          return const_var(c_lhs > c_rhs);
        case Operators::Opers::less_than_equal:
          return const_var(c_lhs <= c_rhs);
        case Operators::Opers::greater_than_equal:
          return const_var(c_lhs >= c_rhs);
        case Operators::Opers::not_equal:
          return const_var(c_lhs != c_rhs);
        case Operators::Opers::sum:
          return const_var(c_lhs + c_rhs);
        case Operators::Opers::quotient:
          check_divide_by_zero(c_rhs);
          return const_var(c_lhs / c_rhs);
        case Operators::Opers::product:
          return const_var(c_lhs * c_rhs);
        case Operators::Opers::difference:
          return const_var(c_lhs - c_rhs);
        default:
          break;
      }

      if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
        switch (t_oper) {
          case Operators::Opers::shift_left:
            return const_var(c_lhs << c_rhs);
          case Operators::Opers::shift_right:
            return const_var(c_lhs >> c_rhs);
          case Operators::Opers::remainder:
            check_divide_by_zero(c_rhs);
            return const_var(c_lhs % c_rhs);
          case Operators::Opers::bitwise_and:
            return const_var(c_lhs & c_rhs);
          case Operators::Opers::bitwise_or:
            return const_var(c_lhs | c_rhs);
          case Operators::Opers::bitwise_xor:
            return const_var(c_lhs ^ c_rhs);
          default:
            break;
        }
      }

      if (t_lhs) {
        switch (t_oper) {
          case Operators::Opers::assign:
            *t_lhs = c_rhs;
            return t_bv;
          case Operators::Opers::assign_product:
            *t_lhs *= c_rhs;
            return t_bv;
          case Operators::Opers::assign_sum:
            *t_lhs += c_rhs;
            return t_bv;
          case Operators::Opers::assign_quotient:
            check_divide_by_zero(c_rhs);
            *t_lhs /= c_rhs;
            return t_bv;
          case Operators::Opers::assign_difference:
            *t_lhs -= c_rhs;
            return t_bv;
          default:
            break;
        }

        if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
          switch (t_oper) {
            case Operators::Opers::assign_bitwise_and:
              check_divide_by_zero(c_rhs);
              *t_lhs &= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_or:
              *t_lhs |= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_left:
              *t_lhs <<= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_right:
              *t_lhs >>= c_rhs;
              return t_bv;
            case Operators::Opers::assign_remainder:
              *t_lhs %= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_xor:
              *t_lhs ^= c_rhs;
              return t_bv;
            default:
              break;
          }
        }
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }